

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_enc.cc
# Opt level: O0

int SSL_export_keying_material
              (SSL *s,uchar *out,size_t olen,char *label,size_t llen,uchar *p,size_t plen,
              int use_context)

{
  string_view label_00;
  string_view label_01;
  Span<const_unsigned_char> context;
  Span<const_unsigned_char> seed1;
  Span<const_unsigned_char> seed2;
  Span<unsigned_char> out_00;
  Span<unsigned_char> out_01;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  uchar *puVar4;
  EVP_MD *digest_00;
  Span<const_unsigned_char> local_128;
  uchar *local_118;
  size_t sStack_110;
  size_t local_108;
  char *pcStack_100;
  Span<const_unsigned_char> local_f8;
  uchar *local_e8;
  uchar *puStack_e0;
  EVP_MD *local_d8;
  EVP_MD *digest;
  SSL_SESSION *session;
  undefined1 local_b8 [8];
  Array<unsigned_char> seed;
  size_t seed_len;
  size_t local_98;
  size_t local_90;
  char *local_88;
  Span<const_unsigned_char> local_80;
  uchar *local_70;
  uchar *local_68;
  undefined1 auStack_60 [8];
  string_view label_sv;
  Span<unsigned_char> out_span;
  uint8_t *context_local;
  size_t label_len_local;
  char *label_local;
  size_t out_len_local;
  uint8_t *out_local;
  SSL *ssl_local;
  
  bssl::Span<unsigned_char>::Span((Span<unsigned_char> *)&label_sv._M_str,out,olen);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,label,llen);
  if ((*(short *)(s->handshake_func + 0xd0) != 0) &&
     (uVar2 = bssl::ssl_protocol_version((SSL *)s), 0x303 < uVar2)) {
    bVar1 = bssl::InplaceVector<unsigned_char,_64UL>::empty
                      ((InplaceVector<unsigned_char,_64UL> *)(s->handshake_func + 0x1a2));
    if (!bVar1) {
      out_span.size_ = (size_t)p;
      if (use_context == 0) {
        out_span.size_ = 0;
        plen = 0;
      }
      local_70 = (uchar *)label_sv._M_str;
      local_68 = out_span.data_;
      bssl::Span<unsigned_char_const>::
      Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
                ((Span<unsigned_char_const> *)&local_80,
                 (InplaceVector<unsigned_char,_64UL> *)(s->handshake_func + 0x1a2));
      local_90 = (size_t)auStack_60;
      local_88 = (char *)label_sv._M_len;
      bssl::Span<const_unsigned_char>::Span
                ((Span<const_unsigned_char> *)&seed_len,(uchar *)out_span.size_,plen);
      out_01.size_ = (size_t)local_68;
      out_01.data_ = local_70;
      label_00._M_str = local_88;
      label_00._M_len = local_90;
      context.size_ = local_98;
      context.data_ = (uchar *)seed_len;
      bVar1 = bssl::tls13_export_keying_material((SSL *)s,out_01,local_80,label_00,context);
      return (uint)bVar1;
    }
    ERR_put_error(0x10,0,0x11c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/t1_enc.cc"
                  ,0xd3);
    return 0;
  }
  iVar3 = SSL_in_init((SSL *)s);
  if ((iVar3 != 0) && (iVar3 = SSL_in_false_start((SSL *)s), iVar3 == 0)) {
    ERR_put_error(0x10,0,0x11c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/t1_enc.cc"
                  ,0xe1);
    return 0;
  }
  seed.size_ = 0x40;
  if (use_context != 0) {
    if (0xffff < plen) {
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/t1_enc.cc"
                    ,0xe8);
      return 0;
    }
    seed.size_ = plen + 0x42;
  }
  bssl::Array<unsigned_char>::Array((Array<unsigned_char> *)local_b8);
  bVar1 = bssl::Array<unsigned_char>::InitForOverwrite((Array<unsigned_char> *)local_b8,seed.size_);
  if (bVar1) {
    puVar4 = bssl::Array<unsigned_char>::data((Array<unsigned_char> *)local_b8);
    OPENSSL_memcpy(puVar4,s->handshake_func + 0x30,0x20);
    puVar4 = bssl::Array<unsigned_char>::data((Array<unsigned_char> *)local_b8);
    OPENSSL_memcpy(puVar4 + 0x20,s->handshake_func + 0x10,0x20);
    if (use_context != 0) {
      puVar4 = bssl::Array<unsigned_char>::operator[]((Array<unsigned_char> *)local_b8,0x40);
      *puVar4 = plen._1_1_;
      puVar4 = bssl::Array<unsigned_char>::operator[]((Array<unsigned_char> *)local_b8,0x41);
      *puVar4 = (uchar)plen;
      puVar4 = bssl::Array<unsigned_char>::data((Array<unsigned_char> *)local_b8);
      OPENSSL_memcpy(puVar4 + 0x42,p,plen);
    }
    digest = (EVP_MD *)SSL_get_session(s);
    digest_00 = bssl::ssl_session_get_digest((SSL_SESSION *)digest);
    local_e8 = (uchar *)label_sv._M_str;
    puStack_e0 = out_span.data_;
    local_d8 = digest_00;
    bssl::Span<unsigned_char_const>::
    Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
              ((Span<unsigned_char_const> *)&local_f8,
               (InplaceVector<unsigned_char,_64UL> *)((long)&digest->flags + 2));
    local_108 = (size_t)auStack_60;
    pcStack_100 = (char *)label_sv._M_len;
    bssl::Span<unsigned_char_const>::
    Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_118,(Array<unsigned_char> *)local_b8);
    bssl::Span<const_unsigned_char>::Span(&local_128);
    out_00.size_ = (size_t)puStack_e0;
    out_00.data_ = local_e8;
    label_01._M_str = pcStack_100;
    label_01._M_len = local_108;
    seed1.size_ = sStack_110;
    seed1.data_ = local_118;
    seed2.size_ = local_128.size_;
    seed2.data_ = local_128.data_;
    bVar1 = bssl::tls1_prf(digest_00,out_00,local_f8,label_01,seed1,seed2);
    ssl_local._4_4_ = (uint)bVar1;
  }
  else {
    ssl_local._4_4_ = 0;
  }
  session._0_4_ = 1;
  bssl::Array<unsigned_char>::~Array((Array<unsigned_char> *)local_b8);
  return ssl_local._4_4_;
}

Assistant:

int SSL_export_keying_material(const SSL *ssl, uint8_t *out, size_t out_len,
                               const char *label, size_t label_len,
                               const uint8_t *context, size_t context_len,
                               int use_context) {
  auto out_span = Span(out, out_len);
  std::string_view label_sv(label, label_len);
  // In TLS 1.3, the exporter may be used whenever the secret has been derived.
  if (ssl->s3->version != 0 && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    if (ssl->s3->exporter_secret.empty()) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_HANDSHAKE_NOT_COMPLETE);
      return 0;
    }
    if (!use_context) {
      context = nullptr;
      context_len = 0;
    }
    return tls13_export_keying_material(ssl, out_span, ssl->s3->exporter_secret,
                                        label_sv, Span(context, context_len));
  }

  // Exporters may be used in False Start, where the handshake has progressed
  // enough. Otherwise, they may not be used during a handshake.
  if (SSL_in_init(ssl) && !SSL_in_false_start(ssl)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_HANDSHAKE_NOT_COMPLETE);
    return 0;
  }

  size_t seed_len = 2 * SSL3_RANDOM_SIZE;
  if (use_context) {
    if (context_len >= 1u << 16) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
      return 0;
    }
    seed_len += 2 + context_len;
  }
  Array<uint8_t> seed;
  if (!seed.InitForOverwrite(seed_len)) {
    return 0;
  }

  OPENSSL_memcpy(seed.data(), ssl->s3->client_random, SSL3_RANDOM_SIZE);
  OPENSSL_memcpy(seed.data() + SSL3_RANDOM_SIZE, ssl->s3->server_random,
                 SSL3_RANDOM_SIZE);
  if (use_context) {
    seed[2 * SSL3_RANDOM_SIZE] = static_cast<uint8_t>(context_len >> 8);
    seed[2 * SSL3_RANDOM_SIZE + 1] = static_cast<uint8_t>(context_len);
    OPENSSL_memcpy(seed.data() + 2 * SSL3_RANDOM_SIZE + 2, context,
                   context_len);
  }

  const SSL_SESSION *session = SSL_get_session(ssl);
  const EVP_MD *digest = ssl_session_get_digest(session);
  return tls1_prf(digest, out_span, session->secret, label_sv, seed, {});
}